

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::CmdLine::terminate(void)

{
  CommandLineDesc *pCVar1;
  
  ui_close_separator();
  pCVar1 = ::(anonymous_namespace)::desc_;
  if (::(anonymous_namespace)::desc_ != (CommandLineDesc *)0x0) {
    anon_unknown.dwarf_5292d::CommandLineDesc::~CommandLineDesc(::(anonymous_namespace)::desc_);
    operator_delete(pCVar1);
  }
  ::(anonymous_namespace)::desc_ = (CommandLineDesc *)0x0;
  return;
}

Assistant:

void terminate() {
            ui_close_separator();
            delete desc_;
            desc_ = nullptr;
        }